

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O0

greatest_test_res file_utils_read_header_3_badfile(void)

{
  uint uVar1;
  char **ppcStack_20;
  int field_count;
  char **field_names;
  FILE *fp;
  
  field_names = (char **)fopen("../tests/data/doesntexist.txt","r");
  uVar1 = read_header((FILE *)field_names,&stack0xffffffffffffffe0);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (uVar1 == 0xffffffff) {
    free_cstr_arr(ppcStack_20,0xffffffffffffffff);
    if (field_names != (char **)0x0) {
      fclose((FILE *)field_names);
    }
    greatest_info.msg = (char *)0x0;
    fp._4_4_ = GREATEST_TEST_RES_PASS;
  }
  else {
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%i",0xffffffff);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%i",(ulong)uVar1);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
    ;
    greatest_info.fail_line = 0x61;
    greatest_info.msg = "Somehow opened the file that doesn\'t exist";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return fp._4_4_;
}

Assistant:

TEST file_utils_read_header_3_badfile(void) {
    FILE *fp = fopen("../tests/data/doesntexist.txt", "r");

    char **field_names;
    int field_count = 0;

    field_count = read_header(fp, &field_names);
    ASSERT_EQ_FMTm("Somehow opened the file that doesn't exist", -1, field_count, "%i");

    free_cstr_arr(field_names, field_count);
    if (fp != NULL)
        fclose(fp);

    PASS();
}